

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void arinvtrans(int p,double *old,double *new1)

{
  void *__src;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  uVar6 = (ulong)(uint)p;
  __src = malloc((long)p * 8);
  if (0 < p) {
    uVar1 = 0;
    do {
      dVar9 = old[uVar1];
      new1[uVar1] = dVar9;
      *(double *)((long)__src + uVar1 * 8) = dVar9;
      uVar1 = uVar1 + 1;
    } while (uVar6 != uVar1);
    if (p != 1) {
      uVar4 = (ulong)(p - 1);
      lVar5 = (uVar6 << 0x20) + -0x200000000;
      uVar7 = 0;
      uVar1 = uVar6;
      uVar8 = uVar4;
      do {
        dVar9 = new1[uVar1 - 1];
        uVar1 = uVar1 - 1;
        uVar3 = 0;
        lVar2 = lVar5;
        do {
          *(double *)((long)__src + uVar3 * 8) =
               (*(double *)((long)new1 + (lVar2 >> 0x1d)) * dVar9 + new1[uVar3]) /
               (1.0 - dVar9 * dVar9);
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + -0x100000000;
        } while (uVar8 != uVar3);
        memcpy(new1,__src,(uVar4 - uVar7) * 8);
        uVar8 = uVar8 - 1;
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + -0x100000000;
      } while (uVar7 != uVar4);
    }
    if (0 < p) {
      uVar1 = 0;
      do {
        dVar9 = atanh(new1[uVar1]);
        new1[uVar1] = dVar9;
        uVar1 = uVar1 + 1;
      } while (uVar6 != uVar1);
    }
  }
  free(__src);
  return;
}

Assistant:

void arinvtrans(int p, double *old, double *new1) {
	int j, k;
	double a;
	double *temp;

	temp = (double*)malloc(sizeof(double)* p);

	for (j = 0; j < p; ++j) {
		temp[j] = new1[j] = old[j];
	}

	for (j = p - 1; j > 0; --j) {
		a = new1[j];
		for (k = 0; k < j; ++k) {
			temp[k] = (new1[k] + a * new1[j - k - 1]) / (1 - a * a);
		}
		for (k = 0; k < j; ++k) {
			new1[k] = temp[k];
		}
	}

	for (j = 0; j < p; ++j) {
		new1[j] = atanh(new1[j]);
	}
	free(temp);
}